

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  long lVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  long *plVar7;
  long lVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  uint uVar22;
  parasail_result_t *ppVar23;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  int32_t *ptr_03;
  int32_t *ptr_04;
  int32_t *ptr_05;
  int32_t *ptr_06;
  int32_t *ptr_07;
  int32_t *ptr_08;
  long lVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  int iVar53;
  int iVar56;
  int iVar57;
  int iVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar66;
  uint uVar67;
  undefined1 auVar62 [16];
  uint uVar69;
  undefined1 auVar63 [16];
  uint uVar68;
  uint uVar70;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar71;
  uint uVar72;
  int iVar81;
  int iVar83;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar82;
  uint uVar84;
  int iVar85;
  uint uVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int32_t iVar94;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined8 uVar95;
  ulong uVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int iVar105;
  int iVar107;
  int iVar108;
  undefined1 auVar106 [16];
  int iVar109;
  int iVar110;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  uint local_328;
  undefined1 local_318 [16];
  uint local_2e4;
  undefined1 local_2b8 [16];
  undefined1 local_278 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  uint local_228;
  uint uStack_224;
  uint uStack_220;
  uint uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_1f8 [16];
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  undefined1 local_1c8 [16];
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  ulong uStack_e0;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar32 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  uVar41 = (ulong)(uint)_s1Len;
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_rowcol_diag_sse41_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_rowcol_diag_sse41_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_00728ff0;
  }
  uVar41 = (ulong)(uint)matrix->length;
LAB_00728ff0:
  iVar34 = -open;
  iVar25 = matrix->min;
  uVar43 = 0x80000000 - iVar25;
  if (iVar25 != iVar34 && SBORROW4(iVar25,iVar34) == iVar25 + open < 0) {
    uVar43 = open | 0x80000000;
  }
  uVar42 = 0x7ffffffe - matrix->max;
  uVar35 = (uint)uVar41;
  ppVar23 = parasail_result_new_rowcol3(uVar35,s2Len);
  if (ppVar23 != (parasail_result_t *)0x0) {
    iVar25 = uVar35 + 3;
    ppVar23->flag = ppVar23->flag | 0x4451001;
    ptr = parasail_memalign_int32_t(0x10,(long)iVar25);
    uVar31 = (ulong)(s2Len + 6);
    ptr_00 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_01 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_02 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_03 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_04 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_05 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_06 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_07 = parasail_memalign_int32_t(0x10,uVar31);
    ptr_08 = parasail_memalign_int32_t(0x10,uVar31);
    auVar87._0_8_ = -(ulong)(ptr == (int32_t *)0x0);
    auVar87._8_8_ = -(ulong)(ptr_00 == (int32_t *)0x0);
    auVar73._0_8_ = -(ulong)(ptr_01 == (int32_t *)0x0);
    auVar73._8_8_ = -(ulong)(ptr_02 == (int32_t *)0x0);
    auVar73 = packssdw(auVar87,auVar73);
    auVar74._0_8_ = -(ulong)(ptr_03 == (int32_t *)0x0);
    auVar74._8_8_ = -(ulong)(ptr_04 == (int32_t *)0x0);
    auVar59._0_8_ = -(ulong)(ptr_05 == (int32_t *)0x0);
    auVar59._8_8_ = -(ulong)(ptr_06 == (int32_t *)0x0);
    auVar59 = packssdw(auVar74,auVar59);
    auVar59 = packssdw(auVar73,auVar59);
    if ((ptr_08 != (int32_t *)0x0 && ptr_07 != (int32_t *)0x0) &&
        ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]))
    {
      local_328 = uVar35 - 1;
      local_2e4 = s2Len - 1;
      uVar43 = uVar43 + 1;
      local_248._4_4_ = iVar34 + gap * -2;
      local_248._0_4_ = -(gap * 3 + open);
      if (0 < (int)uVar35) {
        piVar6 = matrix->mapper;
        uVar31 = 0;
        do {
          ptr[uVar31] = piVar6[(byte)_s1[uVar31]];
          uVar31 = uVar31 + 1;
        } while (uVar41 != uVar31);
      }
      uVar21 = s2Len + 3;
      local_1f8 = ZEXT416(uVar43) << 0x60;
      auVar102._0_4_ = gap * 4;
      auVar102._4_4_ = gap * 4;
      auVar102._8_4_ = gap * 4;
      auVar102._12_4_ = gap * 4;
      local_248._12_4_ = iVar34;
      local_248._8_4_ = iVar34 - gap;
      lVar24 = (long)(int)uVar35;
      iVar27 = uVar35 + 1;
      if ((int)(uVar35 + 1) < iVar25) {
        iVar27 = iVar25;
      }
      uVar41 = 0;
      memset(ptr + lVar24,0,(ulong)(~uVar35 + iVar27) * 4 + 4);
      piVar6 = matrix->mapper;
      do {
        ptr_00[uVar41 + 3] = piVar6[(byte)_s2[uVar41]];
        uVar41 = uVar41 + 1;
      } while (uVar32 != uVar41);
      ptr_00[2] = 0;
      ptr_00[0] = 0;
      ptr_00[1] = 0;
      uVar22 = s2Len + 1U;
      if ((int)(s2Len + 1U) < (int)uVar21) {
        uVar22 = uVar21;
      }
      memset(ptr_00 + uVar32 + 3,0,(ulong)(~s2Len + uVar22) * 4 + 4);
      uVar41 = 0;
      iVar25 = iVar34;
      do {
        ptr_01[uVar41 + 3] = iVar25;
        ptr_02[uVar41 + 3] = 0;
        ptr_03[uVar41 + 3] = 0;
        ptr_04[uVar41 + 3] = 0;
        ptr_05[uVar41 + 3] = uVar43;
        ptr_06[uVar41 + 3] = 0;
        ptr_07[uVar41 + 3] = 0;
        ptr_08[uVar41 + 3] = 0;
        uVar41 = uVar41 + 1;
        iVar25 = iVar25 - gap;
      } while (uVar32 != uVar41);
      lVar28 = 0;
      do {
        *(undefined4 *)((long)ptr_01 + lVar28) = 0;
        *(undefined4 *)((long)ptr_02 + lVar28) = 0;
        *(undefined4 *)((long)ptr_03 + lVar28) = 0;
        *(undefined4 *)((long)ptr_04 + lVar28) = 0;
        *(undefined4 *)((long)ptr_05 + lVar28) = 0;
        *(undefined4 *)((long)ptr_06 + lVar28) = 0;
        *(undefined4 *)((long)ptr_07 + lVar28) = 0;
        *(undefined4 *)((long)ptr_08 + lVar28) = 0;
        lVar28 = lVar28 + 4;
      } while (lVar28 != 0xc);
      lVar28 = 0;
      do {
        ptr_01[uVar32 + lVar28 + 3] = 0;
        ptr_02[uVar32 + lVar28 + 3] = 0;
        ptr_03[uVar32 + lVar28 + 3] = 0;
        ptr_04[uVar32 + lVar28 + 3] = 0;
        ptr_05[uVar32 + lVar28 + 3] = 0;
        ptr_06[uVar32 + lVar28 + 3] = 0;
        ptr_07[uVar32 + lVar28 + 3] = 0;
        ptr_08[uVar32 + lVar28 + 3] = 0;
        lVar28 = lVar28 + 1;
      } while (s2Len + (int)lVar28 < (int)uVar21);
      ptr_01[2] = 0;
      local_228 = uVar42;
      uStack_224 = uVar42;
      uStack_220 = uVar42;
      uStack_21c = uVar42;
      if ((int)uVar35 < 1) {
        local_278._4_4_ = uVar43;
        local_278._0_4_ = uVar43;
        local_278._8_4_ = uVar43;
        local_278._12_4_ = uVar43;
        local_238 = local_278;
        auVar101 = local_278;
        auVar120 = local_278;
        local_218 = local_278;
      }
      else {
        piVar6 = matrix->matrix;
        uVar41 = 1;
        if (1 < (int)uVar21) {
          uVar41 = (ulong)uVar21;
        }
        uVar29 = (ulong)local_2e4;
        uVar37 = (ulong)local_328;
        auVar62 = pmovsxbd(auVar102,0x10203);
        auVar101._4_4_ = uVar43;
        auVar101._0_4_ = uVar43;
        auVar101._8_4_ = uVar43;
        auVar101._12_4_ = uVar43;
        uVar31 = 0;
        auVar120 = auVar101;
        local_278 = auVar101;
        local_238 = auVar101;
        local_218 = auVar101;
        do {
          uVar33 = uVar31 | 1;
          uVar40 = uVar31 | 2;
          uVar39 = uVar31 | 3;
          uVar35 = (uint)uVar31;
          if (matrix->type == 0) {
            uVar21 = ptr[uVar31 + 1];
            uVar22 = ptr[uVar31 + 2];
            uVar26 = ptr[uVar31 + 3];
            uVar20 = ptr[uVar31];
          }
          else {
            uVar21 = local_328;
            if ((long)uVar33 < lVar24) {
              uVar21 = uVar35 | 1;
            }
            uVar22 = uVar35 | 2;
            if (lVar24 <= (long)uVar40) {
              uVar22 = local_328;
            }
            uVar26 = uVar35 | 3;
            uVar20 = uVar35;
            if (lVar24 <= (long)uVar39) {
              uVar26 = local_328;
            }
          }
          puVar3 = (uint *)(ptr + uVar31);
          uVar14 = *puVar3;
          uVar15 = puVar3[1];
          uVar16 = puVar3[2];
          uVar17 = puVar3[3];
          iVar25 = matrix->size;
          uVar1 = uVar31 + 4;
          iVar94 = ptr_01[2];
          ptr_01[2] = iVar34 - (int)uVar1 * gap;
          auVar93 = ZEXT416(iVar34 - uVar35 * gap) << 0x60;
          auVar106 = (undefined1  [16])0x0;
          uVar35 = auVar62._4_4_;
          uVar67 = auVar62._8_4_;
          uVar69 = auVar62._12_4_;
          uVar36 = 0;
          local_128 = 0xfffffffd;
          uStack_124 = 0xfffffffe;
          uStack_120 = 0xffffffff;
          uStack_11c = 0;
          auVar102 = (undefined1  [16])0x0;
          auVar87 = (undefined1  [16])0x0;
          auVar63 = (undefined1  [16])0x0;
          auVar59 = ZEXT816(0);
          local_2b8 = (undefined1  [16])0x0;
          local_118 = local_1f8;
          local_318 = (undefined1  [16])0x0;
          auVar74 = (undefined1  [16])0x0;
          auVar73 = (undefined1  [16])0x0;
          local_f8 = (undefined1  [16])0x0;
          local_108 = (undefined1  [16])0x0;
          local_1c8 = local_1f8;
          iVar27 = 0;
          iVar30 = 0;
          iVar38 = 0;
          uVar95 = 0;
          uVar96 = 0;
          local_e8 = CONCAT44(uVar43,uVar43);
          uStack_e0 = CONCAT44(uVar43,uVar43);
          do {
            iVar113 = auVar93._4_4_;
            iVar115 = auVar93._8_4_;
            iVar117 = auVar93._12_4_;
            iVar4 = ptr_01[uVar36 + 3];
            auVar99._0_8_ = auVar73._4_8_;
            auVar98._0_12_ = auVar73._4_12_;
            auVar98._12_4_ = auVar73._12_4_;
            uVar13 = auVar98._8_8_ & 0xffffffff | (ulong)(uint)ptr_02[uVar36 + 3] << 0x20;
            auVar99._8_8_ = uVar13;
            auVar75._12_4_ = auVar74._12_4_;
            auVar76._0_8_ = auVar74._4_8_;
            auVar75._0_12_ = auVar74._4_12_;
            auVar76._8_8_ = auVar75._8_8_ & 0xffffffff | (ulong)(uint)ptr_03[uVar36 + 3] << 0x20;
            auVar88._12_4_ = auVar87._12_4_;
            auVar89._0_8_ = auVar87._4_8_;
            auVar88._0_12_ = auVar87._4_12_;
            auVar89._8_8_ = auVar88._8_8_ & 0xffffffff | (ulong)(uint)ptr_06[uVar36 + 3] << 0x20;
            auVar103._12_4_ = auVar102._12_4_;
            auVar104._0_8_ = auVar102._4_8_;
            auVar103._0_12_ = auVar102._4_12_;
            auVar104._8_8_ = auVar103._8_8_ & 0xffffffff | (ulong)(uint)ptr_07[uVar36 + 3] << 0x20;
            iVar53 = iVar113 - open;
            iVar56 = iVar115 - open;
            iVar57 = iVar117 - open;
            iVar58 = iVar4 - open;
            iVar105 = local_1c8._4_4_ - gap;
            iVar107 = local_1c8._8_4_ - gap;
            iVar108 = local_1c8._12_4_ - gap;
            iVar109 = ptr_05[uVar36 + 3] - gap;
            auVar121._0_4_ = -(uint)(iVar105 < iVar53);
            auVar121._4_4_ = -(uint)(iVar107 < iVar56);
            auVar121._8_4_ = -(uint)(iVar108 < iVar57);
            auVar121._12_4_ = -(uint)(iVar109 < iVar58);
            auVar87 = blendvps(auVar89,auVar99,auVar121);
            auVar102 = blendvps(auVar104,auVar76,auVar121);
            auVar78._0_8_ = local_318._4_8_;
            auVar77._0_12_ = local_318._4_12_;
            auVar77._12_4_ = local_318._12_4_;
            auVar78._8_8_ = auVar77._8_8_ & 0xffffffff | (ulong)(uint)ptr_04[uVar36 + 3] << 0x20;
            auVar91._0_8_ = auVar106._4_8_;
            auVar90._0_12_ = auVar106._4_12_;
            auVar90._12_4_ = auVar106._12_4_;
            auVar91._8_8_ = auVar90._8_8_ & 0xffffffff | (ulong)(uint)ptr_08[uVar36 + 3] << 0x20;
            auVar92 = blendvps(auVar91,auVar78,auVar121);
            iVar110 = auVar93._0_4_ - open;
            iVar114 = iVar113 - open;
            iVar116 = iVar115 - open;
            iVar118 = iVar117 - open;
            iVar71 = local_118._0_4_ - gap;
            iVar81 = local_118._4_4_ - gap;
            iVar83 = local_118._8_4_ - gap;
            iVar85 = local_118._12_4_ - gap;
            auVar111._0_4_ = -(uint)(iVar71 < iVar110);
            auVar111._4_4_ = -(uint)(iVar81 < iVar114);
            auVar111._8_4_ = -(uint)(iVar83 < iVar116);
            auVar111._12_4_ = -(uint)(iVar85 < iVar118);
            local_2b8 = blendvps(local_2b8,auVar73,auVar111);
            auVar18._8_8_ = uStack_e0;
            auVar18._0_8_ = local_e8;
            auVar119._12_4_ = (uint)(uStack_e0 >> 0x20);
            auVar119._0_12_ = auVar18._4_12_;
            uVar5 = ptr_00[uVar36 + 3];
            local_1c8._0_4_ =
                 (uint)(iVar53 < iVar105) * iVar105 | (uint)(iVar53 >= iVar105) * iVar53;
            local_1c8._4_4_ =
                 (uint)(iVar56 < iVar107) * iVar107 | (uint)(iVar56 >= iVar107) * iVar56;
            local_1c8._8_4_ =
                 (uint)(iVar57 < iVar108) * iVar108 | (uint)(iVar57 >= iVar108) * iVar57;
            local_1c8._12_4_ =
                 (uint)(iVar58 < iVar109) * iVar109 | (uint)(iVar58 >= iVar109) * iVar58;
            auVar100._0_4_ = (uint)(iVar110 < iVar71) * iVar71 | (uint)(iVar110 >= iVar71) * iVar110
            ;
            auVar100._4_4_ = (uint)(iVar114 < iVar81) * iVar81 | (uint)(iVar114 >= iVar81) * iVar114
            ;
            auVar100._8_4_ = (uint)(iVar116 < iVar83) * iVar83 | (uint)(iVar116 >= iVar83) * iVar116
            ;
            auVar100._12_4_ =
                 (uint)(iVar118 < iVar85) * iVar85 | (uint)(iVar118 >= iVar85) * iVar118;
            auVar59 = blendvps(auVar59,auVar74,auVar111);
            auVar121 = blendvps(auVar63,local_318,auVar111);
            uVar61 = iVar27 + piVar6[(long)(int)(uVar26 * iVar25) + (long)ptr_00[uVar36]];
            uVar66 = iVar30 + piVar6[(long)(int)(uVar22 * iVar25) + (long)ptr_00[uVar36 + 1]];
            uVar68 = iVar38 + piVar6[(long)(int)(uVar21 * iVar25) + (long)ptr_00[uVar36 + 2]];
            uVar70 = iVar94 + piVar6[(long)(int)(uVar20 * iVar25) + (long)(int)uVar5];
            uVar72 = ((int)uVar61 < (int)auVar100._0_4_) * auVar100._0_4_ |
                     ((int)uVar61 >= (int)auVar100._0_4_) * uVar61;
            uVar82 = ((int)uVar66 < (int)auVar100._4_4_) * auVar100._4_4_ |
                     ((int)uVar66 >= (int)auVar100._4_4_) * uVar66;
            uVar84 = ((int)uVar68 < (int)auVar100._8_4_) * auVar100._8_4_ |
                     ((int)uVar68 >= (int)auVar100._8_4_) * uVar68;
            uVar86 = ((int)uVar70 < (int)auVar100._12_4_) * auVar100._12_4_ |
                     ((int)uVar70 >= (int)auVar100._12_4_) * uVar70;
            auVar112._0_4_ =
                 (uint)((int)uVar72 < (int)local_1c8._0_4_) * local_1c8._0_4_ |
                 ((int)uVar72 >= (int)local_1c8._0_4_) * uVar72;
            auVar112._4_4_ =
                 (uint)((int)uVar82 < (int)local_1c8._4_4_) * local_1c8._4_4_ |
                 ((int)uVar82 >= (int)local_1c8._4_4_) * uVar82;
            auVar112._8_4_ =
                 (uint)((int)uVar84 < (int)local_1c8._8_4_) * local_1c8._8_4_ |
                 ((int)uVar84 >= (int)local_1c8._8_4_) * uVar84;
            auVar112._12_4_ =
                 (uint)((int)uVar86 < (int)local_1c8._12_4_) * local_1c8._12_4_ |
                 ((int)uVar86 >= (int)local_1c8._12_4_) * uVar86;
            auVar79._0_4_ = -(uint)((int)local_1c8._0_4_ < (int)uVar72);
            auVar79._4_4_ = -(uint)((int)local_1c8._4_4_ < (int)uVar82);
            auVar79._8_4_ = -(uint)((int)local_1c8._8_4_ < (int)uVar84);
            auVar79._12_4_ = -(uint)((int)local_1c8._12_4_ < (int)uVar86);
            auVar74 = blendvps(auVar87,local_2b8,auVar79);
            auVar64._0_4_ = -(uint)(uVar61 == auVar112._0_4_);
            auVar64._4_4_ = -(uint)(uVar66 == auVar112._4_4_);
            auVar64._8_4_ = -(uint)(uVar68 == auVar112._8_4_);
            auVar64._12_4_ = -(uint)(uVar70 == auVar112._12_4_);
            local_1e8 = (int)uVar95;
            iStack_1e4 = (int)((ulong)uVar95 >> 0x20);
            iStack_1e0 = (int)uVar96;
            iStack_1dc = (int)(uVar96 >> 0x20);
            auVar97._0_4_ = local_1e8 + (uint)(uVar17 == (uint)((ulong)local_e8 >> 0x20));
            auVar97._4_4_ = iStack_1e4 + (uint)(uVar16 == (uint)uStack_e0);
            auVar97._8_4_ = iStack_1e0 + (uint)(uVar15 == auVar119._12_4_);
            auVar97._12_4_ = iStack_1dc + (uint)(uVar14 == uVar5);
            auVar73 = blendvps(auVar74,auVar97,auVar64);
            auVar74 = blendvps(auVar102,auVar59,auVar79);
            local_1d8 = local_108._0_4_;
            iStack_1d4 = local_108._4_4_;
            iStack_1d0 = local_108._8_4_;
            iStack_1cc = local_108._12_4_;
            auVar93._0_4_ =
                 local_1d8 + (uint)(0 < piVar6[(long)(int)(uVar26 * iVar25) + (long)ptr_00[uVar36]])
            ;
            auVar93._4_4_ =
                 iStack_1d4 +
                 (uint)(0 < piVar6[(long)(int)(uVar22 * iVar25) + (long)ptr_00[uVar36 + 1]]);
            auVar93._8_4_ =
                 iStack_1d0 +
                 (uint)(0 < piVar6[(long)(int)(uVar21 * iVar25) + (long)ptr_00[uVar36 + 2]]);
            auVar93._12_4_ =
                 iStack_1cc + (uint)(0 < piVar6[(long)(int)(uVar20 * iVar25) + (long)(int)uVar5]);
            auVar74 = blendvps(auVar74,auVar93,auVar64);
            auVar106._0_4_ = auVar92._0_4_ + 1;
            auVar106._4_4_ = auVar92._4_4_ + 1;
            auVar106._8_4_ = auVar92._8_4_ + 1;
            auVar106._12_4_ = auVar92._12_4_ + 1;
            auVar63._0_4_ = auVar121._0_4_ + 1;
            auVar63._4_4_ = auVar121._4_4_ + 1;
            auVar63._8_4_ = auVar121._8_4_ + 1;
            auVar63._12_4_ = auVar121._12_4_ + 1;
            auVar93 = blendvps(auVar106,auVar63,auVar79);
            local_68 = local_f8._0_4_;
            iStack_64 = local_f8._4_4_;
            iStack_60 = local_f8._8_4_;
            iStack_5c = local_f8._12_4_;
            auVar80._0_4_ = local_68 + 1;
            auVar80._4_4_ = iStack_64 + 1;
            auVar80._8_4_ = iStack_60 + 1;
            auVar80._12_4_ = iStack_5c + 1;
            local_318 = blendvps(auVar93,auVar80,auVar64);
            auVar65._0_4_ = -(uint)(local_128 == 0xffffffff);
            auVar65._4_4_ = -(uint)(uStack_124 == 0xffffffff);
            auVar65._8_4_ = -(uint)(uStack_120 == 0xffffffff);
            auVar65._12_4_ = -(uint)(uStack_11c == 0xffffffff);
            auVar93 = blendvps(auVar112,local_248,auVar65);
            auVar73 = ~auVar65 & auVar73;
            auVar74 = ~auVar65 & auVar74;
            local_318 = ~auVar65 & local_318;
            auVar92._4_4_ = uVar43;
            auVar92._0_4_ = uVar43;
            auVar92._8_4_ = uVar43;
            auVar92._12_4_ = uVar43;
            local_118 = blendvps(auVar100,auVar92,auVar65);
            iVar27 = auVar93._0_4_;
            iVar107 = auVar73._0_4_;
            iVar108 = auVar73._4_4_;
            iVar109 = auVar73._8_4_;
            iVar110 = auVar73._12_4_;
            iVar30 = auVar74._0_4_;
            iVar81 = local_318._12_4_;
            iVar38 = auVar93._4_4_;
            iVar53 = auVar93._8_4_;
            iVar56 = auVar93._12_4_;
            iVar83 = auVar74._4_4_;
            iVar85 = auVar74._8_4_;
            iVar105 = auVar74._12_4_;
            iVar57 = local_318._0_4_;
            iVar58 = local_318._4_4_;
            iVar71 = local_318._8_4_;
            if (3 < uVar36) {
              local_228 = (uint)(iVar27 < (int)local_228) * iVar27 |
                          (iVar27 >= (int)local_228) * local_228;
              uStack_224 = (uint)(iVar38 < (int)uStack_224) * iVar38 |
                           (iVar38 >= (int)uStack_224) * uStack_224;
              uStack_220 = (uint)(iVar53 < (int)uStack_220) * iVar53 |
                           (iVar53 >= (int)uStack_220) * uStack_220;
              uStack_21c = (uint)(iVar56 < (int)uStack_21c) * iVar56 |
                           (iVar56 >= (int)uStack_21c) * uStack_21c;
              uVar61 = (uint)((int)local_218._0_4_ < iVar27) * iVar27 |
                       (uint)((int)local_218._0_4_ >= iVar27) * local_218._0_4_;
              uVar66 = (uint)((int)local_218._4_4_ < iVar38) * iVar38 |
                       (uint)((int)local_218._4_4_ >= iVar38) * local_218._4_4_;
              uVar68 = (uint)((int)local_218._8_4_ < iVar53) * iVar53 |
                       (uint)((int)local_218._8_4_ >= iVar53) * local_218._8_4_;
              uVar70 = (uint)((int)local_218._12_4_ < iVar56) * iVar56 |
                       (uint)((int)local_218._12_4_ >= iVar56) * local_218._12_4_;
              uVar72 = (uint)((int)uVar61 < iVar107) * iVar107 | ((int)uVar61 >= iVar107) * uVar61;
              uVar82 = (uint)((int)uVar66 < iVar108) * iVar108 | ((int)uVar66 >= iVar108) * uVar66;
              uVar84 = (uint)((int)uVar68 < iVar109) * iVar109 | ((int)uVar68 >= iVar109) * uVar68;
              uVar86 = (uint)((int)uVar70 < iVar110) * iVar110 | ((int)uVar70 >= iVar110) * uVar70;
              uVar61 = (uint)(iVar30 < iVar57) * iVar57 | (uint)(iVar30 >= iVar57) * iVar30;
              uVar66 = (uint)(iVar83 < iVar58) * iVar58 | (uint)(iVar83 >= iVar58) * iVar83;
              uVar68 = (uint)(iVar85 < iVar71) * iVar71 | (uint)(iVar85 >= iVar71) * iVar85;
              uVar70 = (uint)(iVar105 < iVar81) * iVar81 | (uint)(iVar105 >= iVar81) * iVar105;
              local_218._4_4_ =
                   ((int)uVar82 < (int)uVar66) * uVar66 | ((int)uVar82 >= (int)uVar66) * uVar82;
              local_218._0_4_ =
                   ((int)uVar72 < (int)uVar61) * uVar61 | ((int)uVar72 >= (int)uVar61) * uVar72;
              local_218._8_4_ =
                   ((int)uVar84 < (int)uVar68) * uVar68 | ((int)uVar84 >= (int)uVar68) * uVar84;
              local_218._12_4_ =
                   ((int)uVar86 < (int)uVar70) * uVar70 | ((int)uVar86 >= (int)uVar70) * uVar86;
            }
            bVar47 = uVar31 == uVar37;
            plVar7 = (long *)((ppVar23->field_4).trace)->trace_del_table;
            lVar28 = *plVar7;
            lVar8 = plVar7[4];
            bVar44 = uVar36 < uVar32;
            if (bVar44 && bVar47) {
              *(int *)(lVar28 + uVar36 * 4) = iVar56;
            }
            if (uVar29 == uVar36) {
              *(int *)(lVar8 + uVar31 * 4) = iVar56;
            }
            bVar48 = uVar33 == uVar37;
            bVar45 = uVar36 - 1 < uVar32;
            if (bVar45 && bVar48) {
              *(int *)(lVar28 + -4 + uVar36 * 4) = iVar53;
            }
            bVar10 = (long)uVar33 < lVar24;
            bVar49 = uVar32 == uVar36;
            if (bVar49 && bVar10) {
              *(int *)(lVar8 + uVar33 * 4) = iVar53;
            }
            if ((uVar40 == uVar37) && ((long)(uVar36 - 2) < (long)uVar32 && 1 < uVar36)) {
              *(int *)(lVar28 + -8 + uVar36 * 4) = iVar38;
            }
            bVar11 = (long)uVar40 < lVar24;
            bVar50 = uVar32 + 1 == uVar36;
            if (bVar50 && bVar11) {
              *(int *)(lVar8 + uVar40 * 4) = iVar38;
            }
            bVar51 = uVar39 == uVar37;
            bVar46 = 2 < uVar36;
            if (bVar46 && bVar51) {
              *(int *)(lVar28 + -0xc + uVar36 * 4) = iVar27;
            }
            bVar12 = (long)uVar39 < lVar24;
            bVar52 = uVar32 + 2 == uVar36;
            if (bVar52 && bVar12) {
              *(int *)(lVar8 + uVar39 * 4) = iVar27;
            }
            pvVar9 = ((ppVar23->field_4).trace)->trace_del_table;
            lVar28 = *(long *)((long)pvVar9 + 8);
            lVar8 = *(long *)((long)pvVar9 + 0x28);
            if (bVar44 && bVar47) {
              *(int *)(lVar28 + uVar36 * 4) = iVar110;
            }
            if (uVar29 == uVar36) {
              *(int *)(lVar8 + uVar31 * 4) = iVar110;
            }
            if (bVar45 && bVar48) {
              *(int *)(lVar28 + -4 + uVar36 * 4) = iVar109;
            }
            if (bVar49 && bVar10) {
              *(int *)(lVar8 + uVar33 * 4) = iVar109;
            }
            lVar2 = uVar36 - 2;
            if ((uVar40 == uVar37) && (lVar2 < (long)uVar32 && 1 < uVar36)) {
              *(int *)(lVar28 + -8 + uVar36 * 4) = iVar108;
            }
            if (bVar50 && bVar11) {
              *(int *)(lVar8 + uVar40 * 4) = iVar108;
            }
            if (bVar46 && bVar51) {
              *(int *)(lVar28 + -0xc + uVar36 * 4) = iVar107;
            }
            if (bVar52 && bVar12) {
              *(int *)(lVar8 + uVar39 * 4) = iVar107;
            }
            pvVar9 = ((ppVar23->field_4).trace)->trace_del_table;
            lVar28 = *(long *)((long)pvVar9 + 0x10);
            lVar8 = *(long *)((long)pvVar9 + 0x30);
            if (bVar44 && bVar47) {
              *(int *)(lVar28 + uVar36 * 4) = iVar105;
            }
            if (uVar29 == uVar36) {
              *(int *)(lVar8 + uVar31 * 4) = iVar105;
            }
            if (bVar45 && bVar48) {
              *(int *)(lVar28 + -4 + uVar36 * 4) = iVar85;
            }
            if (bVar49 && bVar10) {
              *(int *)(lVar8 + uVar33 * 4) = iVar85;
            }
            if ((uVar40 == uVar37) && (lVar2 < (long)uVar32 && 1 < uVar36)) {
              *(int *)(lVar28 + -8 + uVar36 * 4) = iVar83;
            }
            if (bVar50 && bVar11) {
              *(int *)(lVar8 + uVar40 * 4) = iVar83;
            }
            if (bVar46 && bVar51) {
              *(int *)(lVar28 + -0xc + uVar36 * 4) = iVar30;
            }
            if (bVar52 && bVar12) {
              *(int *)(lVar8 + uVar39 * 4) = iVar30;
            }
            pvVar9 = ((ppVar23->field_4).trace)->trace_del_table;
            lVar28 = *(long *)((long)pvVar9 + 0x18);
            lVar8 = *(long *)((long)pvVar9 + 0x38);
            if (bVar44 && bVar47) {
              *(int *)(lVar28 + uVar36 * 4) = iVar81;
            }
            if (uVar29 == uVar36) {
              *(int *)(lVar8 + uVar31 * 4) = iVar81;
            }
            if (bVar45 && bVar48) {
              *(int *)(lVar28 + -4 + uVar36 * 4) = iVar71;
            }
            if (bVar49 && bVar10) {
              *(int *)(lVar8 + uVar33 * 4) = iVar71;
            }
            if ((uVar40 == uVar37) && (lVar2 < (long)uVar32 && 1 < uVar36)) {
              *(int *)(lVar28 + -8 + uVar36 * 4) = iVar58;
            }
            if (bVar50 && bVar11) {
              *(int *)(lVar8 + uVar40 * 4) = iVar58;
            }
            if (bVar46 && bVar51) {
              *(int *)(lVar28 + -0xc + uVar36 * 4) = iVar57;
            }
            if (bVar52 && bVar12) {
              *(int *)(lVar8 + uVar39 * 4) = iVar57;
            }
            local_2b8 = ~auVar65 & local_2b8;
            auVar59 = ~auVar65 & auVar59;
            auVar54._0_4_ = -(uint)(local_128 == local_2e4);
            auVar54._4_4_ = -(uint)(uStack_124 == local_2e4);
            auVar54._8_4_ = -(uint)(uStack_120 == local_2e4);
            auVar54._12_4_ = -(uint)(uStack_11c == local_2e4);
            auVar19._4_4_ = -(uint)(uVar35 == local_328);
            auVar19._0_4_ = -(uint)(auVar62._0_4_ == local_328);
            auVar19._8_4_ = -(uint)(uVar67 == local_328);
            auVar19._12_4_ = -(uint)(uVar69 == local_328);
            auVar54 = auVar54 & auVar19;
            auVar120 = blendvps(auVar120,auVar93,auVar54);
            auVar63 = ~auVar65 & auVar63;
            auVar101 = blendvps(auVar101,auVar73,auVar54);
            local_238 = blendvps(local_238,auVar74,auVar54);
            local_278 = blendvps(local_278,local_318,auVar54);
            ptr_01[uVar36] = iVar27;
            ptr_02[uVar36] = iVar107;
            ptr_03[uVar36] = iVar30;
            ptr_04[uVar36] = iVar57;
            ptr_05[uVar36] = local_1c8._0_4_;
            ptr_06[uVar36] = auVar87._0_4_;
            ptr_07[uVar36] = auVar102._0_4_;
            ptr_08[uVar36] = auVar106._0_4_;
            local_128 = local_128 + 1;
            uStack_124 = uStack_124 + 1;
            uStack_120 = uStack_120 + 1;
            uStack_11c = uStack_11c + 1;
            uVar36 = uVar36 + 1;
            iVar27 = iVar113;
            iVar30 = iVar115;
            iVar38 = iVar117;
            iVar94 = iVar4;
            uVar95 = auVar99._0_8_;
            uVar96 = uVar13;
            local_108 = auVar76;
            local_f8 = auVar78;
            local_e8 = auVar18._4_8_;
            uStack_e0 = auVar119._8_8_ & 0xffffffff | (ulong)uVar5 << 0x20;
          } while (uVar41 != uVar36);
          auVar62._0_4_ = auVar62._0_4_ + 4;
          auVar62._4_4_ = uVar35 + 4;
          auVar62._8_4_ = uVar67 + 4;
          auVar62._12_4_ = uVar69 + 4;
          local_248._4_4_ = local_248._4_4_ + gap * -4;
          local_248._0_4_ = local_248._0_4_ + gap * -4;
          local_248._8_4_ = local_248._8_4_ + gap * -4;
          local_248._12_4_ = local_248._12_4_ + gap * -4;
          uVar31 = uVar1;
        } while ((long)uVar1 < lVar24);
      }
      iVar25 = 4;
      uVar31 = (ulong)uVar43;
      uVar29 = (ulong)uVar43;
      uVar32 = uVar31;
      uVar41 = uVar31;
      do {
        uVar37 = extractps(auVar120,3);
        if ((int)uVar32 < (int)uVar37) {
          uVar29 = extractps(auVar101,3);
          uVar31 = extractps(local_238,3);
          uVar41 = extractps(local_278,3);
          uVar32 = uVar37 & 0xffffffff;
        }
        iVar38 = (int)uVar41;
        iVar34 = (int)uVar31;
        iVar27 = (int)uVar29;
        iVar30 = (int)uVar32;
        lVar24 = auVar120._8_8_;
        uVar37 = auVar120._0_8_;
        auVar120._0_8_ = uVar37 << 0x20;
        auVar120._8_8_ = lVar24 << 0x20 | uVar37 >> 0x20;
        lVar24 = auVar101._8_8_;
        uVar37 = auVar101._0_8_;
        auVar101._0_8_ = uVar37 << 0x20;
        auVar101._8_8_ = lVar24 << 0x20 | uVar37 >> 0x20;
        lVar24 = local_238._8_8_;
        uVar37 = local_238._0_8_;
        local_238._0_8_ = uVar37 << 0x20;
        local_238._8_8_ = lVar24 << 0x20 | uVar37 >> 0x20;
        lVar24 = local_278._8_8_;
        uVar37 = local_278._0_8_;
        local_278._0_8_ = uVar37 << 0x20;
        local_278._8_8_ = lVar24 << 0x20 | uVar37 >> 0x20;
        iVar25 = iVar25 + -1;
      } while (iVar25 != 0);
      auVar55._0_4_ = -(uint)((int)local_228 < (int)uVar43);
      auVar55._4_4_ = -(uint)((int)uStack_224 < (int)uVar43);
      auVar55._8_4_ = -(uint)((int)uStack_220 < (int)uVar43);
      auVar55._12_4_ = -(uint)((int)uStack_21c < (int)uVar43);
      auVar60._0_4_ = -(uint)((int)uVar42 < (int)local_218._0_4_);
      auVar60._4_4_ = -(uint)((int)uVar42 < (int)local_218._4_4_);
      auVar60._8_4_ = -(uint)((int)uVar42 < (int)local_218._8_4_);
      auVar60._12_4_ = -(uint)((int)uVar42 < (int)local_218._12_4_);
      iVar25 = movmskps(0,auVar60 | auVar55);
      if (iVar25 != 0) {
        *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
        iVar30 = 0;
        iVar27 = 0;
        iVar34 = 0;
        iVar38 = 0;
        local_2e4 = 0;
        local_328 = 0;
      }
      ppVar23->score = iVar30;
      ppVar23->end_query = local_328;
      ppVar23->end_ref = local_2e4;
      ((ppVar23->field_4).stats)->matches = iVar27;
      ((ppVar23->field_4).stats)->similar = iVar34;
      ((ppVar23->field_4).stats)->length = iVar38;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar23;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _HM_pr = NULL;
    int32_t * restrict _HS_pr = NULL;
    int32_t * restrict _HL_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict _FM_pr = NULL;
    int32_t * restrict _FS_pr = NULL;
    int32_t * restrict _FL_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict HM_pr = NULL;
    int32_t * restrict HS_pr = NULL;
    int32_t * restrict HL_pr = NULL;
    int32_t * restrict F_pr = NULL;
    int32_t * restrict FM_pr = NULL;
    int32_t * restrict FS_pr = NULL;
    int32_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vZero = _mm_set1_epi32(0);
    vNegInf0 = _mm_insert_epi32(vZero, NEG_LIMIT, 3);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int32_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi32(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vNM = _mm_srli_si128(vWM, 4);
            vNM = _mm_insert_epi32(vNM, HM_pr[j], 3);
            vNS = _mm_srli_si128(vWS, 4);
            vNS = _mm_insert_epi32(vNS, HS_pr[j], 3);
            vNL = _mm_srli_si128(vWL, 4);
            vNL = _mm_insert_epi32(vNL, HL_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vFM = _mm_srli_si128(vFM, 4);
            vFM = _mm_insert_epi32(vFM, FM_pr[j], 3);
            vFS = _mm_srli_si128(vFS, 4);
            vFS = _mm_insert_epi32(vFS, FS_pr[j], 3);
            vFL = _mm_srli_si128(vFL, 4);
            vFL = _mm_insert_epi32(vFL, FL_pr[j], 3);
            vF_opn = _mm_sub_epi32(vNH, vOpen);
            vF_ext = _mm_sub_epi32(vF, vGap);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vE_opn = _mm_sub_epi32(vWH, vOpen);
            vE_ext = _mm_sub_epi32(vE, vGap);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 4);
            vs2 = _mm_insert_epi32(vs2, s2[j], 3);
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            case1 = _mm_cmpeq_epi32(vWH, vNWH);
            case2 = _mm_cmpeq_epi32(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi32(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi32(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi32(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi32(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi32(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            HM_pr[j-3] = (int32_t)_mm_extract_epi32(vWM,0);
            HS_pr[j-3] = (int32_t)_mm_extract_epi32(vWS,0);
            HL_pr[j-3] = (int32_t)_mm_extract_epi32(vWL,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            FM_pr[j-3] = (int32_t)_mm_extract_epi32(vFM,0);
            FS_pr[j-3] = (int32_t)_mm_extract_epi32(vFS,0);
            FL_pr[j-3] = (int32_t)_mm_extract_epi32(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int32_t) _mm_extract_epi32(vMaxM, 3);
            similar = (int32_t) _mm_extract_epi32(vMaxS, 3);
            length= (int32_t) _mm_extract_epi32(vMaxL, 3);
        }
        vMaxH = _mm_slli_si128(vMaxH, 4);
        vMaxM = _mm_slli_si128(vMaxM, 4);
        vMaxS = _mm_slli_si128(vMaxS, 4);
        vMaxL = _mm_slli_si128(vMaxL, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}